

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.cpp
# Opt level: O3

idx_t __thiscall
duckdb::CSVEncoder::Encode
          (CSVEncoder *this,FileHandle *file_handle_input,char *output_buffer,
          idx_t decoded_buffer_size)

{
  idx_t *piVar1;
  CSVEncoderBuffer *pCVar2;
  optional_ptr<duckdb::EncodingFunction,_true> *this_00;
  EncodingFunction *pEVar3;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  reference pvVar8;
  int64_t iVar9;
  bool bVar10;
  char *pcVar11;
  byte bVar12;
  idx_t i;
  size_type __n;
  idx_t output_buffer_pos;
  vector<char,_true> pass_on_buffer;
  idx_t local_80;
  char *local_78;
  iterator iStack_70;
  char *local_68;
  idx_t local_58;
  FileHandle *local_50;
  char *local_48;
  idx_t *local_40;
  char *local_38;
  
  local_80 = 0;
  uVar7 = (this->remaining_bytes_buffer).cur_pos;
  piVar1 = &(this->remaining_bytes_buffer).actual_encoded_buffer_size;
  if (uVar7 < (this->remaining_bytes_buffer).actual_encoded_buffer_size) {
    pCVar2 = &this->remaining_bytes_buffer;
    pcVar11 = (this->remaining_bytes_buffer).encoded_buffer._M_t.
              super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
    uVar6 = 1;
    do {
      local_80 = uVar6;
      output_buffer[local_80 - 1] = pcVar11[uVar7];
      uVar7 = pCVar2->cur_pos + 1;
      pCVar2->cur_pos = uVar7;
      uVar6 = local_80 + 1;
    } while (uVar7 < *piVar1);
    pCVar2->cur_pos = 0;
    (this->remaining_bytes_buffer).actual_encoded_buffer_size = 0;
  }
  pCVar2 = &this->encoded_buffer;
  local_58 = decoded_buffer_size;
  local_50 = file_handle_input;
  if ((this->encoded_buffer).cur_pos < (this->encoded_buffer).actual_encoded_buffer_size) {
    optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(&this->encoding_function);
    pEVar3 = (this->encoding_function).ptr;
    (*pEVar3->encode_function)
              (pCVar2,output_buffer,&local_80,local_58,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,piVar1,pEVar3);
  }
  this_00 = &this->encoding_function;
  local_48 = &this->pass_on_byte;
  local_40 = piVar1;
  local_38 = output_buffer;
  do {
    iVar4 = local_80;
    if (local_58 <= local_80) {
      return local_80;
    }
    local_78 = (char *)0x0;
    iStack_70._M_current = (char *)0x0;
    local_68 = (char *)0x0;
    if ((this->encoded_buffer).cur_pos != (this->encoded_buffer).actual_encoded_buffer_size) {
      optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00);
      uVar7 = (this->encoded_buffer).actual_encoded_buffer_size - (this->encoded_buffer).cur_pos;
      if (uVar7 < ((this->encoding_function).ptr)->lookup_bytes) {
        for (; optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00),
            uVar7 < this_00->ptr->lookup_bytes; uVar7 = uVar7 + 1) {
          pcVar11 = (this->encoded_buffer).encoded_buffer._M_t.
                    super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl + uVar7;
          if (iStack_70._M_current == local_68) {
            ::std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_78,iStack_70,pcVar11);
          }
          else {
            *iStack_70._M_current = *pcVar11;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
      }
    }
    pCVar2->cur_pos = 0;
    (this->encoded_buffer).actual_encoded_buffer_size = 0;
    if (iStack_70._M_current == local_78) {
      uVar7 = 0;
    }
    else {
      __n = 0;
      do {
        pvVar8 = vector<char,_true>::operator[]((vector<char,_true> *)&local_78,__n);
        (this->encoded_buffer).encoded_buffer._M_t.
        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl[__n] = *pvVar8;
        __n = __n + 1;
        uVar7 = (long)iStack_70._M_current - (long)local_78;
      } while (__n < uVar7);
    }
    bVar12 = this->has_pass_on_byte;
    if ((bool)bVar12 != false) {
      (this->encoded_buffer).encoded_buffer._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar7] = this->pass_on_byte;
      bVar12 = this->has_pass_on_byte;
    }
    uVar7 = FileHandle::Read(local_50,iStack_70._M_current + ((ulong)bVar12 - (long)local_78) +
                                      (long)(this->encoded_buffer).encoded_buffer._M_t.
                                            super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                            .super__Head_base<0UL,_char_*,_false>._M_head_impl,
                             (this->encoded_buffer).encoded_buffer_size -
                             (long)(iStack_70._M_current + ((ulong)bVar12 - (long)local_78)));
    (this->encoded_buffer).actual_encoded_buffer_size =
         (ulong)this->has_pass_on_byte + ((long)iStack_70._M_current - (long)local_78) + uVar7;
    if (uVar7 < (this->encoded_buffer).encoded_buffer_size -
                ((long)iStack_70._M_current - (long)local_78)) {
LAB_014e6307:
      (this->encoded_buffer).last_buffer = true;
      bVar10 = false;
    }
    else {
      iVar9 = FileHandle::Read(local_50,local_48,1);
      bVar10 = true;
      if (iVar9 == 0) goto LAB_014e6307;
    }
    this->has_pass_on_byte = bVar10;
    optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00);
    pEVar3 = (this->encoding_function).ptr;
    (*pEVar3->encode_function)
              (pCVar2,local_38,&local_80,local_58,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,local_40,pEVar3);
    iVar5 = local_80;
    if (local_78 != (char *)0x0) {
      operator_delete(local_78);
    }
    if (iVar5 == iVar4) {
      return iVar4;
    }
  } while( true );
}

Assistant:

idx_t CSVEncoder::Encode(FileHandle &file_handle_input, char *output_buffer, const idx_t decoded_buffer_size) {
	idx_t output_buffer_pos = 0;
	// Check if we have some left-overs. These can either be
	// 1. missing decoded bytes
	if (remaining_bytes_buffer.HasDataToRead()) {
		D_ASSERT(remaining_bytes_buffer.cur_pos == 0);
		const auto remaining_bytes_buffer_ptr = remaining_bytes_buffer.Ptr();
		for (; remaining_bytes_buffer.cur_pos < remaining_bytes_buffer.GetSize(); remaining_bytes_buffer.cur_pos++) {
			output_buffer[output_buffer_pos++] = remaining_bytes_buffer_ptr[remaining_bytes_buffer.cur_pos];
		}
		remaining_bytes_buffer.Reset();
	}
	// 2. remaining encoded buffer
	if (encoded_buffer.HasDataToRead()) {
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
	}
	// 3. a new encoded buffer from the file
	while (output_buffer_pos < decoded_buffer_size) {
		idx_t current_decoded_buffer_start = output_buffer_pos;
		vector<char> pass_on_buffer;
		if (encoded_buffer.cur_pos != encoded_buffer.GetSize() &&
		    encoding_function->GetLookupBytes() > encoded_buffer.GetSize() - encoded_buffer.cur_pos) {
			// We don't have enough lookup bytes for it, if that's the case, we need to set off these bytes to the next
			// buffer
			for (idx_t i = encoded_buffer.GetSize() - encoded_buffer.cur_pos; i < encoding_function->GetLookupBytes();
			     i++) {
				pass_on_buffer.push_back(encoded_buffer.Ptr()[i]);
			}
		}
		encoded_buffer.Reset();
		for (idx_t i = 0; i < pass_on_buffer.size(); i++) {
			encoded_buffer.Ptr()[i] = pass_on_buffer[i];
		}
		if (has_pass_on_byte) {
			encoded_buffer.Ptr()[pass_on_buffer.size()] = pass_on_byte;
		}
		auto actual_encoded_bytes = static_cast<idx_t>(
		    file_handle_input.Read(encoded_buffer.Ptr() + pass_on_buffer.size() + has_pass_on_byte,
		                           encoded_buffer.GetCapacity() - pass_on_buffer.size() - has_pass_on_byte));
		encoded_buffer.SetSize(actual_encoded_bytes + pass_on_buffer.size() + has_pass_on_byte);
		if (actual_encoded_bytes < encoded_buffer.GetCapacity() - pass_on_buffer.size()) {
			encoded_buffer.last_buffer = true;
			has_pass_on_byte = false;
		} else {
			auto bytes_read = static_cast<idx_t>(file_handle_input.Read(&pass_on_byte, 1));
			if (bytes_read == 0) {
				encoded_buffer.last_buffer = true;
				has_pass_on_byte = false;
			} else {
				has_pass_on_byte = true;
			}
		}
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
		if (output_buffer_pos == current_decoded_buffer_start) {
			return output_buffer_pos;
		}
	}
	return output_buffer_pos;
}